

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

BatchedMatMulLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_batchedmatmul(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x415) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x415;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    BatchedMatMulLayerParams::BatchedMatMulLayerParams(this_00.batchedmatmul_);
    (this->layer_).batchedmatmul_ = (BatchedMatMulLayerParams *)this_00;
  }
  return (BatchedMatMulLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::BatchedMatMulLayerParams* NeuralNetworkLayer::mutable_batchedmatmul() {
  if (!has_batchedmatmul()) {
    clear_layer();
    set_has_batchedmatmul();
    layer_.batchedmatmul_ = new ::CoreML::Specification::BatchedMatMulLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.batchedMatmul)
  return layer_.batchedmatmul_;
}